

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O2

Cdr * __thiscall
eprosima::fastcdr::Cdr::deserializeArray(Cdr *this,int16_t *short_t,size_t numElements)

{
  char **ppcVar1;
  size_t __n;
  size_t sVar2;
  NotEnoughMemoryException *this_00;
  char *pcVar3;
  char *pcVar4;
  char local_20 [8];
  
  sVar2 = alignment(this,2);
  pcVar4 = (this->m_currentPosition).m_currentPosition;
  if (sVar2 + numElements * 2 <=
      (ulong)((long)(this->m_lastPosition).m_currentPosition - (long)pcVar4)) {
    this->m_lastDataSize = 2;
    if (numElements != 0) {
      pcVar4 = pcVar4 + sVar2;
      (this->m_currentPosition).m_currentPosition = pcVar4;
    }
    __n = numElements * 2;
    if (this->m_swapBytes == true) {
      pcVar4 = pcVar4 + 1;
      for (pcVar3 = local_20; pcVar3 < local_20 + __n; pcVar3 = pcVar3 + 2) {
        (this->m_currentPosition).m_currentPosition = pcVar4;
        pcVar3[1] = pcVar4[-1];
        (this->m_currentPosition).m_currentPosition = pcVar4 + 1;
        *pcVar3 = *pcVar4;
        pcVar4 = pcVar4 + 2;
      }
    }
    else {
      memcpy(short_t,pcVar4,__n);
      ppcVar1 = &(this->m_currentPosition).m_currentPosition;
      *ppcVar1 = *ppcVar1 + __n;
    }
    return this;
  }
  this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
  exception::NotEnoughMemoryException::NotEnoughMemoryException
            (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
  __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
              exception::NotEnoughMemoryException::~NotEnoughMemoryException);
}

Assistant:

Cdr& Cdr::deserializeArray(int16_t *short_t, size_t numElements)
{
    size_t align = alignment(sizeof(*short_t));
    size_t totalSize = sizeof(*short_t) * numElements;
    size_t sizeAligned = totalSize + align;

    if((m_lastPosition - m_currentPosition) >= sizeAligned)
    {
        // Save last datasize.
        m_lastDataSize = sizeof(*short_t);

        // Align if there are any elements
        if(numElements)
            makeAlign(align);

        if(m_swapBytes)
        {
            char *dst = reinterpret_cast<char*>(&short_t);
            char *end = dst + totalSize;

            for(; dst < end; dst += sizeof(*short_t))
            {
                m_currentPosition++ >> dst[1];
                m_currentPosition++ >> dst[0];
            }
        }
        else
        {
            m_currentPosition.rmemcopy(short_t, totalSize);
            m_currentPosition += totalSize;
        }

        return *this;
    }

    throw NotEnoughMemoryException(NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
}